

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

Ptr __thiscall r_comp::RepliMacro::expandMacro(RepliMacro *this,RepliStruct *oldStruct)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  element_type *peVar5;
  string *psVar6;
  __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var7;
  size_type in_RCX;
  __fn *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  void *__child_stack_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  void *in_R8;
  Ptr PVar9;
  undefined1 local_2f0 [16];
  __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
  local_2e0;
  __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
  local_2d8;
  const_iterator iSrcEnd;
  __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
  local_2c8;
  const_iterator iSrc;
  __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
  local_2b8;
  const_iterator iOld;
  Ptr findStruct;
  undefined1 local_288 [56];
  __cxx11 local_250 [32];
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [48];
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  __fn *local_20;
  RepliStruct *oldStruct_local;
  RepliMacro *this_local;
  Ptr *newStruct;
  
  local_20 = in_RDX;
  oldStruct_local = oldStruct;
  this_local = this;
  bVar1 = std::operator==((shared_ptr<r_comp::RepliStruct> *)&oldStruct->field_0x20,(nullptr_t)0x0);
  if (bVar1) {
    std::operator+((char *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Macro \'");
    std::operator+(local_40,(char *)local_60);
    std::__cxx11::string::operator+=((string *)&oldStruct->field_0x40,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string(local_60);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)this,(nullptr_t)0x0);
    _Var8._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::operator==((shared_ptr<r_comp::RepliStruct> *)&oldStruct->field_0x30,(nullptr_t)0x0
                           );
    if (bVar1) {
      std::operator+((char *)local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Macro \'"
                    );
      std::operator+(local_90,(char *)local_b0);
      std::__cxx11::string::operator+=((string *)&oldStruct->field_0x40,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string(local_b0);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)this,(nullptr_t)0x0);
      _Var8._M_pi = extraout_RDX_00;
    }
    else if (local_20 == (__fn *)0x0) {
      std::operator+((char *)local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Macro \'"
                    );
      std::operator+(local_d0,(char *)local_f0);
      std::__cxx11::string::operator+=((string *)&oldStruct->field_0x40,(string *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string(local_f0);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)this,(nullptr_t)0x0);
      _Var8._M_pi = extraout_RDX_01;
    }
    else {
      iVar2 = std::__cxx11::string::compare((string *)(local_20 + 8));
      if (iVar2 == 0) {
        peVar3 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&oldStruct->field_0x20);
        sVar4 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::size(&peVar3->args);
        if (sVar4 != 0) {
          peVar3 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&oldStruct->field_0x20);
          sVar4 = std::
                  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  ::size(&peVar3->args);
          in_RCX = std::
                   vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   ::size((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                           *)(local_20 + 0xb0));
          if (sVar4 != in_RCX) {
            std::operator+((char *)local_230,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Macro \'");
            std::operator+(local_210,(char *)local_230);
            peVar3 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&oldStruct->field_0x20);
            sVar4 = std::
                    vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ::size(&peVar3->args);
            std::__cxx11::to_string(local_250,sVar4);
            std::operator+(local_1f0,local_210);
            std::operator+(local_1d0,(char *)local_1f0);
            sVar4 = std::
                    vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ::size((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                            *)(local_20 + 0xb0));
            std::__cxx11::to_string((__cxx11 *)(local_288 + 0x18),sVar4);
            std::operator+(local_1b0,local_1d0);
            std::operator+(local_190,(char *)local_1b0);
            std::__cxx11::string::operator+=((string *)&oldStruct->field_0x40,(string *)local_190);
            std::__cxx11::string::~string((string *)local_190);
            std::__cxx11::string::~string((string *)local_1b0);
            std::__cxx11::string::~string((string *)(local_288 + 0x18));
            std::__cxx11::string::~string((string *)local_1d0);
            std::__cxx11::string::~string((string *)local_1f0);
            std::__cxx11::string::~string((string *)local_250);
            std::__cxx11::string::~string((string *)local_210);
            std::__cxx11::string::~string(local_230);
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                      ((shared_ptr<r_comp::RepliStruct> *)this,(nullptr_t)0x0);
            _Var8._M_pi = extraout_RDX_03;
            goto LAB_0018662b;
          }
        }
        iVar2 = (int)in_RCX;
        local_288[0x17] = 0;
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr((shared_ptr<r_comp::RepliStruct> *)this);
        peVar3 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&oldStruct->field_0x20);
        sVar4 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::size(&peVar3->args);
        if ((sVar4 == 0) &&
           (sVar4 = std::
                    vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ::size((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                            *)(local_20 + 0xb0)), sVar4 != 0)) {
          RepliStruct::clone((RepliStruct *)local_288,local_20,__child_stack,iVar2,in_R8);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)this,
                     (shared_ptr<r_comp::RepliStruct> *)local_288);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)local_288);
          peVar3 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&oldStruct->field_0x30);
          peVar5 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::__cxx11::string::operator=((string *)&peVar5->cmd,(string *)&peVar3->cmd);
          peVar3 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::__cxx11::string::operator=((string *)&peVar3->label,(string *)(local_20 + 0x48));
          local_288[0x17] = 1;
          _Var8._M_pi = extraout_RDX_04;
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&oldStruct->field_0x30);
          RepliStruct::clone((RepliStruct *)
                             &findStruct.
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(__fn *)peVar3,__child_stack_00,iVar2,in_R8);
          __r = &findStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)this,(shared_ptr<r_comp::RepliStruct> *)__r)
          ;
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)__r);
          psVar6 = (string *)(local_20 + 0x48);
          peVar3 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::__cxx11::string::operator=((string *)&peVar3->label,psVar6);
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr((shared_ptr<r_comp::RepliStruct> *)&iOld)
          ;
          iSrc._M_current =
               (shared_ptr<r_comp::RepliStruct> *)
               std::
               vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ::begin((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        *)(local_20 + 0xb0));
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<r_comp::RepliStruct>const*,std::vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>>
          ::__normal_iterator<std::shared_ptr<r_comp::RepliStruct>*>
                    ((__normal_iterator<std::shared_ptr<r_comp::RepliStruct>const*,std::vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>>
                      *)&local_2b8,
                     (__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                      *)&iSrc);
          peVar3 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&oldStruct->field_0x20);
          iSrcEnd._M_current =
               (shared_ptr<r_comp::RepliStruct> *)
               std::
               vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ::begin(&peVar3->args);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<r_comp::RepliStruct>const*,std::vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>>
          ::__normal_iterator<std::shared_ptr<r_comp::RepliStruct>*>
                    ((__normal_iterator<std::shared_ptr<r_comp::RepliStruct>const*,std::vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>>
                      *)&local_2c8,
                     (__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                      *)&iSrcEnd);
          peVar3 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&oldStruct->field_0x20);
          local_2e0._M_current =
               (shared_ptr<r_comp::RepliStruct> *)
               std::
               vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ::end(&peVar3->args);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<r_comp::RepliStruct>const*,std::vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>>
          ::__normal_iterator<std::shared_ptr<r_comp::RepliStruct>*>
                    ((__normal_iterator<std::shared_ptr<r_comp::RepliStruct>const*,std::vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>>
                      *)&local_2d8,&local_2e0);
          while (bVar1 = __gnu_cxx::operator!=(&local_2c8,&local_2d8), bVar1) {
            peVar3 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            p_Var7 = (__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)__gnu_cxx::
                        __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                        ::operator*(&local_2c8);
            std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(p_Var7);
            RepliStruct::findAtom((RepliStruct *)local_2f0,(string *)peVar3);
            std::shared_ptr<r_comp::RepliStruct>::operator=
                      ((shared_ptr<r_comp::RepliStruct> *)&iOld,
                       (shared_ptr<r_comp::RepliStruct> *)local_2f0);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                      ((shared_ptr<r_comp::RepliStruct> *)local_2f0);
            bVar1 = std::operator!=((shared_ptr<r_comp::RepliStruct> *)&iOld,(nullptr_t)0x0);
            if (bVar1) {
              p_Var7 = (__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)__gnu_cxx::
                          __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                          ::operator*(&local_2b8);
              peVar3 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*(p_Var7);
              peVar5 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&iOld);
              RepliStruct::operator=(peVar5,peVar3);
            }
            __gnu_cxx::
            __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
            ::operator++(&local_2c8);
            __gnu_cxx::
            __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
            ::operator++(&local_2b8);
          }
          local_288[0x17] = 1;
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)&iOld);
          _Var8._M_pi = extraout_RDX_05;
        }
        if ((local_288[0x17] & 1) == 0) {
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)this)
          ;
          _Var8._M_pi = extraout_RDX_06;
        }
      }
      else {
        std::operator+((char *)local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Macro \'");
        std::operator+(local_150,(char *)local_170);
        std::operator+(local_130,local_150);
        std::operator+(local_110,(char *)local_130);
        std::__cxx11::string::operator+=((string *)&oldStruct->field_0x40,(string *)local_110);
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string(local_170);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)this,(nullptr_t)0x0);
        _Var8._M_pi = extraout_RDX_02;
      }
    }
  }
LAB_0018662b:
  PVar9.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  PVar9.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar9.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr RepliMacro::expandMacro(RepliStruct *oldStruct)
{
    if (src == nullptr) {
        error += "Macro '" + name + "' source not defined. ";
        return nullptr;
    }

    if (dest == nullptr) {
        error += "Macro '" + name + "' destination not defined. ";
        return nullptr;
    }

    if (oldStruct == nullptr) {
        error += "Macro '" + name + "' cannot expand empty structure. ";
        return nullptr;
    }

    if (oldStruct->cmd.compare(this->name) != 0) {
        error += "Macro '" + name + "' cannot expand structure with different name '" + oldStruct->cmd + "'. ";
        return nullptr;
    }

    if ((src->args.size() > 0) && (src->args.size() != oldStruct->args.size())) {
        error += "Macro '" + name + "' requires " + std::to_string(src->args.size()) + " arguments, cannot expand structure with " + std::to_string(oldStruct->args.size()) + " arguments. ";
        return nullptr;
    }

    RepliStruct::Ptr newStruct;

    // Special case of macros without args, just copy in the args from oldStruct
    if ((src->args.size() == 0) && (oldStruct->args.size() > 0)) {
        newStruct = oldStruct->clone();
        newStruct->cmd = dest->cmd;
        newStruct->label = oldStruct->label;
        return newStruct;
    } else {
        newStruct = dest->clone();
        newStruct->label = oldStruct->label;
    }

    RepliStruct::Ptr findStruct;
    std::vector<RepliStruct::Ptr>::const_iterator iOld(oldStruct->args.begin());

    for (std::vector<RepliStruct::Ptr>::const_iterator iSrc(src->args.begin()), iSrcEnd(src->args.end()); iSrc != iSrcEnd; ++iSrc, ++iOld) {
        // printf("looking for '%s'\n", (*iSrc)->cmd.c_str());
        // find the Atom inside newStruct with the name of iSrc->cmd
        findStruct = newStruct->findAtom((*iSrc)->cmd);

        if (findStruct != nullptr) {
            // overwrite data in findStruct with the matching one from old
            *findStruct = *(*iOld);
        }
    }

    return newStruct;
}